

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestCaseStats::TestCaseStats(TestCaseStats *this,TestCaseStats *param_2)

{
  size_type sVar1;
  size_type sVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  size_type sVar5;
  long in_RSI;
  TestCaseInfo *in_RDI;
  TestCaseInfo *unaff_retaddr;
  
  *(undefined ***)&in_RDI->name = &PTR__TestCaseStats_002f4f70;
  TestCaseInfo::TestCaseInfo(unaff_retaddr,in_RDI);
  *(undefined8 *)((long)&in_RDI[1].className.field_2 + 8) = *(undefined8 *)(in_RSI + 0xe0);
  sVar1 = *(size_type *)(in_RSI + 0xb0);
  sVar2 = *(size_type *)(in_RSI + 0xb8);
  uVar3 = *(undefined8 *)(in_RSI + 0xc0);
  uVar4 = *(undefined8 *)(in_RSI + 200);
  sVar5 = *(size_type *)(in_RSI + 0xd8);
  in_RDI[1].className._M_string_length = *(size_type *)(in_RSI + 0xd0);
  in_RDI[1].className.field_2._M_allocated_capacity = sVar5;
  *(undefined8 *)((long)&in_RDI[1].name.field_2 + 8) = uVar3;
  *(undefined8 *)&in_RDI[1].className = uVar4;
  in_RDI[1].name._M_string_length = sVar1;
  in_RDI[1].name.field_2._M_allocated_capacity = sVar2;
  std::__cxx11::string::string((string *)&in_RDI[1].description,(string *)(in_RSI + 0xe8));
  std::__cxx11::string::string((string *)&in_RDI[1].tags,(string *)(in_RSI + 0x108));
  *(byte *)&in_RDI[1].lcaseTags.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = *(byte *)(in_RSI + 0x128) & 1;
  return;
}

Assistant:

TestCaseStats( TestCaseStats const& )              = default;